

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O1

bool __thiscall CMessageHeader::IsCommandValid(CMessageHeader *this)

{
  uchar uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  bVar3 = false;
  lVar4 = 4;
  do {
    uVar1 = (this->pchMessageStart)._M_elems[lVar4];
    if (uVar1 == '\0') {
      if (lVar4 < 0x10) {
        do {
          if ((this->pchMessageStart)._M_elems[lVar4] != '\0') goto LAB_006b3ff8;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        lVar4 = 0x10;
      }
    }
    else if ((byte)(uVar1 + 0x81) < 0xa1) break;
    bVar3 = 0xe < lVar4;
    bVar2 = lVar4 < 0xf;
    lVar4 = lVar4 + 1;
  } while (bVar2);
LAB_006b3ff8:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CMessageHeader::IsCommandValid() const
{
    // Check the command string for errors
    for (const char* p1 = pchCommand; p1 < pchCommand + COMMAND_SIZE; ++p1) {
        if (*p1 == 0) {
            // Must be all zeros after the first zero
            for (; p1 < pchCommand + COMMAND_SIZE; ++p1) {
                if (*p1 != 0) {
                    return false;
                }
            }
        } else if (*p1 < ' ' || *p1 > 0x7E) {
            return false;
        }
    }

    return true;
}